

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::StateInteractionCase::iterate(StateInteractionCase *this)

{
  TextureFormat TVar1;
  RenderContext *pRVar2;
  glUniform4fFunc p_Var3;
  glProgramUniform4fFunc p_Var4;
  StateInteractionCase *pSVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  GLint GVar9;
  GLuint GVar10;
  GLuint GVar11;
  GLenum GVar12;
  GLuint GVar13;
  uint uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar15;
  TestError *pTVar16;
  GLSLVersion glslVersion;
  GLSLVersion glslVersion_00;
  int height;
  char *pcVar17;
  GLuint pipeline;
  GLint value;
  StateInteractionCase *local_470;
  char *srcStrings [1];
  GLuint indexBuf;
  GLuint vertexBuf;
  GLuint vao;
  Surface renderedFrame;
  string frag;
  string vtx;
  string noMain;
  string frag2;
  Surface local_3a0;
  Surface local_388;
  Surface local_370;
  Surface local_358;
  Surface local_340;
  float position [16];
  Surface local_2e8;
  VertexArrayBinding posArray;
  undefined1 local_280 [8];
  IndexType local_278;
  deUint16 *local_270;
  ShaderProgram progVF;
  Functions *gl;
  
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar7);
  local_470 = this;
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = *(int *)CONCAT44(extraout_var_00,iVar8);
  if (0xf < iVar7) {
    iVar7 = 0x10;
  }
  iVar8 = ((int *)CONCAT44(extraout_var_00,iVar8))[1];
  height = 0x10;
  if (iVar8 < 0x10) {
    height = iVar8;
  }
  tcu::Surface::Surface(&renderedFrame,iVar7,height);
  vtx._M_dataplus._M_p = (pointer)&vtx.field_2;
  vtx._M_string_length = 0;
  vtx.field_2._M_local_buf[0] = '\0';
  frag._M_dataplus._M_p = (pointer)&frag.field_2;
  frag._M_string_length = 0;
  frag2._M_dataplus._M_p = (pointer)&frag2.field_2;
  frag2._M_string_length = 0;
  frag.field_2._M_local_buf[0] = '\0';
  frag2.field_2._M_local_buf[0] = '\0';
  local_280 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
  std::operator<<((ostream *)&local_278,"Begin:StateInteractionCase iterate");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
  (*gl->viewport)(0,0,iVar7,height);
  (*gl->clearColor)(0.0,0.0,0.0,0.0);
  (*gl->clear)(0x4000);
  pSVar5 = local_470;
  generateBasicVertexSrc_abi_cxx11_
            ((string *)local_280,(glcts *)(ulong)local_470->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)&vtx,(string *)local_280);
  std::__cxx11::string::~string((string *)local_280);
  generateBasicFragmentSrc_abi_cxx11_
            ((string *)local_280,(glcts *)(ulong)pSVar5->m_glslVersion,glslVersion_00);
  std::__cxx11::string::operator=((string *)&frag,(string *)local_280);
  std::__cxx11::string::~string((string *)local_280);
  pRVar2 = ((pSVar5->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&posArray,vtx._M_dataplus._M_p,(allocator<char> *)&noMain);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)position,frag._M_dataplus._M_p,(allocator<char> *)&value);
  glu::makeVtxFragSources((ProgramSources *)local_280,(string *)&posArray,(string *)position);
  glu::ShaderProgram::ShaderProgram(&progVF,pRVar2,(ProgramSources *)local_280);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_280);
  std::__cxx11::string::~string((string *)position);
  std::__cxx11::string::~string((string *)&posArray);
  (*gl->useProgram)(progVF.m_program.m_program);
  p_Var3 = gl->uniform4f;
  GVar9 = (*gl->getUniformLocation)(progVF.m_program.m_program,"u_color");
  (*p_Var3)(GVar9,0.0,1.0,0.0,1.0);
  (*gl->genProgramPipelines)(1,&pipeline);
  std::__cxx11::string::_M_assign((string *)&frag2);
  while( true ) {
    uVar15 = std::__cxx11::string::find((char *)&frag2,0x17fcb91);
    if (uVar15 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)&frag2,uVar15,(char *)0x7);
  }
  srcStrings[0] = vtx._M_dataplus._M_p;
  GVar10 = (*gl->createShaderProgramv)(0x8b31,1,srcStrings);
  bVar6 = checkCSProg(local_470,gl,GVar10,1);
  if (bVar6) {
    srcStrings[0] = frag2._M_dataplus._M_p;
    GVar11 = (*gl->createShaderProgramv)(0x8b30,1,srcStrings);
    bVar6 = checkCSProg(local_470,gl,GVar11,1);
    if (bVar6) {
      p_Var4 = gl->programUniform4f;
      GVar9 = (*gl->getUniformLocation)(GVar11,"u_clrPB");
      (*p_Var4)(GVar11,GVar9,0.0,0.0,1.0,1.0);
      (*gl->useProgramStages)(pipeline,1,GVar10);
      (*gl->useProgramStages)(pipeline,2,GVar11);
      (*gl->bindProgramPipeline)(pipeline);
      position[0xc] = 1.0;
      position[0xd] = 1.0;
      position[0xe] = -1.0;
      position[0xf] = 1.0;
      position[8] = 1.0;
      position[9] = -1.0;
      position[10] = 0.0;
      position[0xb] = 1.0;
      position[4] = -1.0;
      position[5] = 1.0;
      position[6] = 0.0;
      position[7] = 1.0;
      position[0] = -1.0;
      position[1] = -1.0;
      position[2] = 1.0;
      position[3] = 1.0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_280,"a_position",(allocator<char> *)&noMain);
      glu::va::Float(&posArray,(string *)local_280,4,4,0,position);
      std::__cxx11::string::~string((string *)local_280);
      local_280._0_4_ = R;
      local_280._4_4_ = UNORM_INT32;
      local_278 = INDEXTYPE_UINT16;
      local_270 = iterate::quadIndices;
      glu::draw(((local_470->super_TestCase).m_context)->m_renderCtx,progVF.m_program.m_program,1,
                &posArray,(PrimitiveList *)local_280,(DrawUtilCallback *)0x0);
      GVar12 = (*gl->getError)();
      glu::checkError(GVar12,"StateInteraction glu::draw failure",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                      ,0x8c3);
      pRVar2 = ((local_470->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_280,&renderedFrame);
      glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_280);
      tcu::Surface::Surface(&local_340,&renderedFrame);
      bVar6 = checkSurface(local_470,&local_340,(RGBA)0xff00ff00);
      tcu::Surface::~Surface(&local_340);
      if (!bVar6) {
        pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar16,"StateInteraction failed; surface should be green",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x8ca);
        __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      GVar13 = (*gl->getAttribLocation)(progVF.m_program.m_program,"a_position");
      uVar14 = (*((local_470->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      if ((uVar14 & 0x300) == 0) {
        (*gl->disableVertexAttribArray)(GVar13);
      }
      (*gl->genVertexArrays)(1,&vao);
      (*gl->bindVertexArray)(vao);
      (*gl->genBuffers)(1,&indexBuf);
      (*gl->bindBuffer)(0x8893,indexBuf);
      (*gl->bufferData)(0x8893,0xc,iterate::quadIndices,0x88e4);
      (*gl->genBuffers)(1,&vertexBuf);
      (*gl->bindBuffer)(0x8892,vertexBuf);
      (*gl->bufferData)(0x8892,0x40,position,0x88e4);
      GVar13 = (*gl->getAttribLocation)(GVar10,"a_position");
      (*gl->vertexAttribPointer)(GVar13,4,0x1406,'\0',0,(void *)0x0);
      (*gl->enableVertexAttribArray)(GVar13);
      (*gl->bindBuffer)(0x8892,0);
      GVar12 = (*gl->getError)();
      glu::checkError(GVar12,"VAO setup failure",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                      ,0x8e4);
      (*gl->useProgram)(0);
      (*gl->bindProgramPipeline)(pipeline);
      (*gl->drawElements)(4,6,0x1403,(void *)0x0);
      GVar12 = (*gl->getError)();
      glu::checkError(GVar12,"DrawElements failure",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                      ,0x8ed);
      pRVar2 = ((local_470->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_280,&renderedFrame);
      glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_280);
      tcu::Surface::Surface(&local_358,&renderedFrame);
      bVar6 = checkSurface(local_470,&local_358,(RGBA)0xffff0000);
      tcu::Surface::~Surface(&local_358);
      if (bVar6) {
        (*gl->useProgram)(0);
        (*gl->bindProgramPipeline)(0);
        (*gl->drawElements)(4,6,0x1403,(void *)0x0);
        GVar12 = (*gl->getError)();
        glu::checkError(GVar12,"DrawElements failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x8fd);
        (*gl->useProgramStages)(pipeline,1,0);
        (*gl->useProgramStages)(pipeline,2,GVar11);
        (*gl->bindProgramPipeline)(pipeline);
        (*gl->drawElements)(4,6,0x1403,(void *)0x0);
        GVar12 = (*gl->getError)();
        glu::checkError(GVar12,"DrawElements failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x905);
        (*gl->useProgramStages)(pipeline,1,GVar10);
        (*gl->useProgramStages)(pipeline,2,0);
        (*gl->drawElements)(4,6,0x1403,(void *)0x0);
        GVar12 = (*gl->getError)();
        glu::checkError(GVar12,"DrawElements failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x90b);
        (*gl->useProgramStages)(pipeline,3,GVar10);
        (*gl->drawElements)(4,6,0x1403,(void *)0x0);
        GVar12 = (*gl->getError)();
        glu::checkError(GVar12,"DrawElements failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x911);
        (*gl->programParameteri)(progVF.m_program.m_program,0x8258,1);
        (*gl->linkProgram)(progVF.m_program.m_program);
        (*gl->useProgramStages)(pipeline,1,progVF.m_program.m_program);
        (*gl->drawElements)(4,6,0x1403,(void *)0x0);
        GVar12 = (*gl->getError)();
        if (GVar12 == 0x502) {
          (*gl->validateProgramPipeline)(pipeline);
          (*gl->getProgramPipelineiv)(pipeline,0x8b83,&value);
          if (value == 0) {
            (*gl->useProgramStages)(pipeline,1,0);
            (*gl->useProgramStages)(pipeline,2,progVF.m_program.m_program);
            (*gl->validateProgramPipeline)(pipeline);
            (*gl->getProgramPipelineiv)(pipeline,0x8b83,&value);
            if (value == 0) {
              (*gl->drawElements)(4,6,0x1403,(void *)0x0);
              GVar12 = (*gl->getError)();
              if (GVar12 == 0x502) {
                (*gl->useProgramStages)(pipeline,1,GVar10);
                (*gl->useProgramStages)(pipeline,2,GVar11);
                p_Var4 = gl->programUniform4f;
                GVar9 = (*gl->getUniformLocation)(GVar11,"u_clrPB");
                (*p_Var4)(GVar11,GVar9,1.0,0.0,0.0,1.0);
                (*gl->deleteProgram)(GVar11);
                (*gl->drawElements)(4,6,0x1403,(void *)0x0);
                pRVar2 = ((local_470->super_TestCase).m_context)->m_renderCtx;
                tcu::Surface::getAccess((PixelBufferAccess *)local_280,&renderedFrame);
                glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_280);
                tcu::Surface::Surface(&local_370,&renderedFrame);
                bVar6 = checkSurface(local_470,&local_370,(RGBA)0xff0000ff);
                tcu::Surface::~Surface(&local_370);
                if (bVar6) {
                  srcStrings[0] = frag2._M_dataplus._M_p;
                  GVar11 = (*gl->createShaderProgramv)(0x8b30,1,srcStrings);
                  bVar6 = checkCSProg(local_470,gl,GVar11,1);
                  if (bVar6) {
                    p_Var4 = gl->programUniform4f;
                    GVar9 = (*gl->getUniformLocation)(GVar11,"u_clrPB");
                    (*p_Var4)(GVar11,GVar9,0.0,1.0,0.0,1.0);
                    (*gl->useProgramStages)(pipeline,2,GVar11);
                    GVar13 = (*gl->createShader)(0x8b30);
                    srcStrings[0] = frag._M_dataplus._M_p;
                    (*gl->shaderSource)(GVar13,1,srcStrings,(GLint *)0x0);
                    (*gl->compileShader)(GVar13);
                    (*gl->getShaderiv)(GVar13,0x8b81,&value);
                    (*gl->attachShader)(GVar11,GVar13);
                    (*gl->getProgramiv)(GVar11,0x8b82,&value);
                    if (value == 1) {
                      (*gl->drawElements)(4,6,0x1403,(void *)0x0);
                      GVar12 = (*gl->getError)();
                      glu::checkError(GVar12,"DrawElements failure",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                      ,0x969);
                      pRVar2 = ((local_470->super_TestCase).m_context)->m_renderCtx;
                      tcu::Surface::getAccess((PixelBufferAccess *)local_280,&renderedFrame);
                      glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_280);
                      tcu::Surface::Surface(&local_388,&renderedFrame);
                      bVar6 = checkSurface(local_470,&local_388,(RGBA)0xff00ff00);
                      tcu::Surface::~Surface(&local_388);
                      if (bVar6) {
                        p_Var4 = gl->programUniform4f;
                        GVar9 = (*gl->getUniformLocation)(GVar11,"u_clrPB");
                        (*p_Var4)(GVar11,GVar9,1.0,1.0,1.0,1.0);
                        std::__cxx11::string::string((string *)&noMain,(string *)&frag);
                        uVar15 = std::__cxx11::string::find((char *)&noMain,0x173edb8);
                        std::__cxx11::string::replace((ulong)&noMain,uVar15,&DAT_00000004);
                        srcStrings[0] = noMain._M_dataplus._M_p;
                        (*gl->shaderSource)(GVar13,1,srcStrings,(GLint *)0x0);
                        (*gl->compileShader)(GVar13);
                        (*gl->getShaderiv)(GVar13,0x8b81,&value);
                        (*gl->attachShader)(GVar11,GVar13);
                        (*gl->linkProgram)(GVar11);
                        (*gl->getError)();
                        (*gl->getProgramiv)(GVar11,0x8b82,&value);
                        if (value == 0) {
                          (*gl->drawElements)(4,6,0x1403,(void *)0x0);
                          pRVar2 = ((local_470->super_TestCase).m_context)->m_renderCtx;
                          tcu::Surface::getAccess((PixelBufferAccess *)local_280,&renderedFrame);
                          glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_280);
                          tcu::Surface::Surface(&local_3a0,&renderedFrame);
                          bVar6 = checkSurface(local_470,&local_3a0,(RGBA)0xffffffff);
                          tcu::Surface::~Surface(&local_3a0);
                          if (bVar6) {
                            (*gl->deleteProgram)(GVar10);
                            (*gl->deleteProgram)(GVar11);
                            iVar7 = 0;
                            do {
                              if (iVar7 == 6) {
                                (*gl->bindProgramPipeline)(0);
                                (*gl->bindVertexArray)(0);
                                (*gl->deleteProgramPipelines)(1,&pipeline);
                                (*gl->deleteShader)(GVar13);
                                (*gl->deleteVertexArrays)(1,&vao);
                                (*gl->deleteBuffers)(1,&indexBuf);
                                (*gl->deleteBuffers)(1,&vertexBuf);
                                tcu::TestContext::setTestResult
                                          ((local_470->super_TestCase).super_TestCase.super_TestNode
                                           .m_testCtx,QP_TEST_RESULT_PASS,"Pass");
                                std::__cxx11::string::~string((string *)&noMain);
                                std::__cxx11::string::~string((string *)&posArray.binding.name);
                                glu::ShaderProgram::~ShaderProgram(&progVF);
                                std::__cxx11::string::~string((string *)&frag2);
                                std::__cxx11::string::~string((string *)&frag);
                                std::__cxx11::string::~string((string *)&vtx);
                                tcu::Surface::~Surface(&renderedFrame);
                                return STOP;
                              }
                              for (iVar8 = 0; iVar8 != 6; iVar8 = iVar8 + 1) {
                                generateVarLinkVertexShaderSrc
                                          (local_470,&vtx,local_470->m_glslVersion,iVar8);
                                generateVarLinkFragmentShaderSrc
                                          (local_470,&frag,local_470->m_glslVersion,iVar7);
                                srcStrings[0] = vtx._M_dataplus._M_p;
                                GVar10 = (*gl->createShaderProgramv)(0x8b31,1,srcStrings);
                                bVar6 = checkCSProg(local_470,gl,GVar10,1);
                                if (!bVar6) {
                                  pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                                  tcu::TestError::TestError
                                            (pTVar16,"CreateShaderProgramv failed for vertex shader"
                                             ,(char *)0x0,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                             ,0x9a6);
LAB_00c01e8e:
                                  __cxa_throw(pTVar16,&tcu::TestError::typeinfo,
                                              tcu::Exception::~Exception);
                                }
                                srcStrings[0] = frag._M_dataplus._M_p;
                                GVar11 = (*gl->createShaderProgramv)(0x8b30,1,srcStrings);
                                bVar6 = checkCSProg(local_470,gl,GVar11,1);
                                if (!bVar6) {
                                  pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                                  tcu::TestError::TestError
                                            (pTVar16,
                                             "CreateShaderProgramv failed for fragment shader",
                                             (char *)0x0,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                             ,0x9ad);
                                  goto LAB_00c01e8e;
                                }
                                (*gl->useProgramStages)(pipeline,1,GVar10);
                                (*gl->useProgramStages)(pipeline,2,GVar11);
                                GVar12 = (*gl->getError)();
                                glu::checkError(GVar12,"UseProgramStages failure",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                ,0x9b2);
                                (*gl->validateProgramPipeline)(pipeline);
                                (*gl->getProgramPipelineiv)(pipeline,0x8b83,&value);
                                if (iVar7 == iVar8) {
                                  if (value != 1) {
                                    local_280 = (undefined1  [8])TVar1;
                                    std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)&local_278);
                                    std::operator<<((ostream *)&local_278,
                                                                                                        
                                                  "Matched input and output variables should validate successfully.\n"
                                                  );
                                    std::operator<<((ostream *)&local_278,"Vertex Shader:\n");
                                    std::operator<<((ostream *)&local_278,(string *)&vtx);
                                    std::operator<<((ostream *)&local_278,"Fragment Shader:\n");
                                    std::operator<<((ostream *)&local_278,(string *)&frag);
                                    tcu::MessageBuilder::operator<<
                                              ((MessageBuilder *)local_280,
                                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)&local_278);
                                    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                                    tcu::TestError::TestError
                                              (pTVar16,"StateInteraction failed",(char *)0x0,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                               ,0x9c0);
                                    goto LAB_00c01e8e;
                                  }
                                  (*gl->clear)(0x4000);
                                  p_Var4 = gl->programUniform4f;
                                  GVar9 = (*gl->getUniformLocation)(GVar10,"u_color");
                                  (*p_Var4)(GVar10,GVar9,1.0,1.0,1.0,1.0);
                                  (*gl->drawElements)(4,6,0x1403,(void *)0x0);
                                  GVar12 = (*gl->getError)();
                                  glu::checkError(GVar12,"DrawElements failure",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                                  ,0x9c6);
                                  pRVar2 = ((local_470->super_TestCase).m_context)->m_renderCtx;
                                  tcu::Surface::getAccess
                                            ((PixelBufferAccess *)local_280,&renderedFrame);
                                  glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_280);
                                  tcu::Surface::Surface(&local_2e8,&renderedFrame);
                                  bVar6 = checkSurface(local_470,&local_2e8,(RGBA)0xffffffff);
                                  tcu::Surface::~Surface(&local_2e8);
                                  if (!bVar6) {
                                    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                                    tcu::TestError::TestError
                                              (pTVar16,
                                               "StateInteraction failed; surface should be white",
                                               (char *)0x0,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                               ,0x9cd);
                                    goto LAB_00c01e8e;
                                  }
                                }
                                else {
                                  uVar14 = (*((local_470->super_TestCase).m_context)->m_renderCtx->
                                             _vptr_RenderContext[2])();
                                  if ((value != 0) == ((uVar14 & 0x300) == 0)) {
                                    local_280 = (undefined1  [8])TVar1;
                                    std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)&local_278);
                                    std::operator<<((ostream *)&local_278,
                                                                                                        
                                                  "Mismatched input and output variables; validation should "
                                                  );
                                    uVar14 = (*((local_470->super_TestCase).m_context)->m_renderCtx
                                               ->_vptr_RenderContext[2])();
                                    pcVar17 = "succeed.\n";
                                    if ((uVar14 & 0x300) == 0) {
                                      pcVar17 = "fail.\n";
                                    }
                                    std::operator<<((ostream *)&local_278,pcVar17);
                                    std::operator<<((ostream *)&local_278,"Vertex Shader:\n");
                                    std::operator<<((ostream *)&local_278,(string *)&vtx);
                                    std::operator<<((ostream *)&local_278,"Fragment Shader:\n");
                                    std::operator<<((ostream *)&local_278,(string *)&frag);
                                    tcu::MessageBuilder::operator<<
                                              ((MessageBuilder *)local_280,
                                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)&local_278);
                                    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                                    tcu::TestError::TestError
                                              (pTVar16,"StateInteraction failed",(char *)0x0,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                               ,0x9dc);
                                    goto LAB_00c01e8e;
                                  }
                                }
                                (*gl->deleteProgram)(GVar10);
                                (*gl->deleteProgram)(GVar11);
                              }
                              iVar7 = iVar7 + 1;
                            } while( true );
                          }
                          pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                          tcu::TestError::TestError
                                    (pTVar16,"StateInteraction failed; surface should be white",
                                     (char *)0x0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                     ,0x991);
                        }
                        else {
                          pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                          tcu::TestError::TestError
                                    (pTVar16,"StateInteraction failed; link failure",(char *)0x0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                     ,0x987);
                        }
                        __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                      }
                      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar16,"StateInteraction failed; surface should be green",
                                 (char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                 ,0x970);
                    }
                    else {
                      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar16,"Shader attachment shouldn\'t affect link status",
                                 (char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                                 ,0x965);
                    }
                    __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                  pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar16,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x952);
                }
                else {
                  pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar16,"StateInteraction failed; surface should be red",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x94a);
                }
              }
              else {
                pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar16,"DrawElements failed",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                           ,0x938);
              }
            }
            else {
              pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar16,"Program pipeline validation failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                         ,0x931);
            }
          }
          else {
            pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar16,"Program pipeline validation failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x925);
          }
          __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar16,"DrawElements failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x91d);
      }
      else {
        pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar16,"StateInteraction failed; surface should be blue",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x8f4);
      }
      __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar16,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x8b3);
  }
  else {
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar16,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x8ad);
  }
  __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&				 log		  = m_testCtx.getLog();
		const glw::Functions&	gl			  = m_context.getRenderContext().getFunctions();
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		int						 viewportW	= de::min(16, renderTarget.getWidth());
		int						 viewportH	= de::min(16, renderTarget.getHeight());
		tcu::Surface			 renderedFrame(viewportW, viewportH);

		glw::GLuint programA, programB;
		glw::GLuint vao, vertexBuf, indexBuf;
		std::string vtx;
		std::string frag, frag2;
		glw::GLuint pipeline;
		const char* srcStrings[1];
		glw::GLenum err;

		log << TestLog::Message << "Begin:StateInteractionCase iterate" << TestLog::EndMessage;

		gl.viewport(0, 0, viewportW, viewportH);
		gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);

		// Check the precedence of glUseProgram over glBindProgramPipeline
		// The program bound with glUseProgram will draw green, the programs
		// bound with glBindProgramPipeline will render blue.
		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		glu::ShaderProgram progVF(m_context.getRenderContext(), glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

		gl.useProgram(progVF.getProgram());
		// Ouput green in the fragment shader
		gl.uniform4f(gl.getUniformLocation(progVF.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Create and bind a pipeline with a different fragment shader
		gl.genProgramPipelines(1, &pipeline);
		// Use a different uniform name in another fragment shader
		frag2	  = frag;
		size_t pos = 0;
		while ((pos = frag2.find("u_color", pos)) != std::string::npos)
		{
			frag2.replace(pos, 7, "u_clrPB");
			pos += 7;
		}

		srcStrings[0] = vtx.c_str();
		programA	  = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, srcStrings);
		if (!checkCSProg(gl, programA))
		{
			TCU_FAIL("CreateShaderProgramv failed for vertex shader");
		}
		srcStrings[0] = frag2.c_str();
		programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
		if (!checkCSProg(gl, programB))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}
		// Program B outputs blue.
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 0.0f, 0.0f, 1.0f, 1.0f);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
		gl.bindProgramPipeline(pipeline);

		static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };
		const float			  position[]	= { -1.0f, -1.0f, +1.0f, 1.0f, -1.0f, +1.0f, 0.0f,  1.0f,
								   +1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		// Draw a quad with glu::draw
		glu::VertexArrayBinding posArray = glu::va::Float("a_position", 4, 4, 0, &position[0]);
		glu::draw(m_context.getRenderContext(), progVF.getProgram(), 1, &posArray,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "StateInteraction glu::draw failure");

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// useProgram takes precedence and the buffer should be green
		if (!checkSurface(renderedFrame, tcu::RGBA::green()))
		{
			TCU_FAIL("StateInteraction failed; surface should be green");
		}

		// The position attribute locations may be different.
		int posLoc = gl.getAttribLocation(progVF.getProgram(), "a_position");

		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
			gl.disableVertexAttribArray(posLoc);

		/* Set up a vertex array object */
		gl.genVertexArrays(1, &vao);
		gl.bindVertexArray(vao);

		gl.genBuffers(1, &indexBuf);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(quadIndices), quadIndices, GL_STATIC_DRAW);

		gl.genBuffers(1, &vertexBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuf);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(position), position, GL_STATIC_DRAW);

		posLoc = gl.getAttribLocation(programA, "a_position");
		gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);
		gl.enableVertexAttribArray(posLoc);
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);

		GLU_EXPECT_NO_ERROR(gl.getError(), "VAO setup failure");

		// bindProgramPipeline without a program installed by useProgram
		// Rerender the quad.  Don't use glu::draw because it takes the
		// program as a parameter and sets state.
		gl.useProgram(0);
		gl.bindProgramPipeline(pipeline);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// bindProgramPipeline will render blue
		if (!checkSurface(renderedFrame, tcu::RGBA::blue()))
		{
			TCU_FAIL("StateInteraction failed; surface should be blue");
		}

		// Test rendering with no program bound.  Rendering is undefined
		// but shouldn't produce an error.
		gl.useProgram(0);
		gl.bindProgramPipeline(0);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		// Render call with missing pipeline stages should not generate an error
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, 0);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
		gl.bindProgramPipeline(pipeline);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, 0);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		// Missing program for fragment shader
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, programA);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		// Separable program with both vertex and fragment shaders attached to only one stage

		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progVF.getProgram());
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, progVF.getProgram());

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("DrawElements failed");
		}

		gl.validateProgramPipeline(pipeline);
		glw::GLint value;
		gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("Program pipeline validation failed");
		}

		// attached to just the fragment shader
		// Call validateProgramPipeline before rendering this time
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, 0);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, progVF.getProgram());

		gl.validateProgramPipeline(pipeline);
		gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("Program pipeline validation failed");
		}

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("DrawElements failed");
		}

		// Program deletion
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);

		// Program B renders red this time
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 1.0f, 0.0f, 0.0f, 1.0f);

		gl.deleteProgram(programB);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// expect red
		if (!checkSurface(renderedFrame, tcu::RGBA::red()))
		{
			TCU_FAIL("StateInteraction failed; surface should be red");
		}

		// Attach new shader
		srcStrings[0] = frag2.c_str();
		programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
		if (!checkCSProg(gl, programB))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}
		// Render green
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 0.0f, 1.0f, 0.0f, 1.0f);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);

		// new shader
		glw::GLuint vshader = gl.createShader(GL_FRAGMENT_SHADER);
		srcStrings[0]		= frag.c_str(); // First frag shader with u_color uniform
		gl.shaderSource(vshader, 1, srcStrings, NULL);
		gl.compileShader(vshader);
		gl.getShaderiv(vshader, GL_COMPILE_STATUS, &value);
		DE_ASSERT(value == GL_TRUE);
		gl.attachShader(programB, vshader);

		// changing shader shouldn't affect link_status
		gl.getProgramiv(programB, GL_LINK_STATUS, &value);
		if (value != 1)
		{
			TCU_FAIL("Shader attachment shouldn't affect link status");
		}

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// expect green
		if (!checkSurface(renderedFrame, tcu::RGBA::green()))
		{
			TCU_FAIL("StateInteraction failed; surface should be green");
		}

		// Negative Case: Unsuccessfully linked program should not affect current program

		// Render white
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 1.0f, 1.0f, 1.0f, 1.0f);
		std::string noMain = frag;
		pos				   = noMain.find("main", 0);
		noMain.replace(pos, 4, "niaM");

		srcStrings[0] = noMain.c_str();
		gl.shaderSource(vshader, 1, srcStrings, NULL);
		gl.compileShader(vshader);
		gl.getShaderiv(vshader, GL_COMPILE_STATUS, &value);
		gl.attachShader(programB, vshader);
		gl.linkProgram(programB);
		err = gl.getError();

		// link_status should be false
		gl.getProgramiv(programB, GL_LINK_STATUS, &value);
		if (value != 0)
		{
			TCU_FAIL("StateInteraction failed; link failure");
		}

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// expect white
		if (!checkSurface(renderedFrame, tcu::RGBA::white()))
		{
			TCU_FAIL("StateInteraction failed; surface should be white");
		}

		gl.deleteProgram(programA);
		gl.deleteProgram(programB);

		// Shader interface matching inputs/outputs

		int maxVars = 6; // generate code supports 6 variables
		for (int numInputs = 0; numInputs < maxVars; numInputs++)
		{
			for (int numOutputs = 0; numOutputs < maxVars; numOutputs++)
			{

				generateVarLinkVertexShaderSrc(vtx, m_glslVersion, numOutputs);
				generateVarLinkFragmentShaderSrc(frag, m_glslVersion, numInputs);

				srcStrings[0] = vtx.c_str();
				programA	  = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programA))
				{
					TCU_FAIL("CreateShaderProgramv failed for vertex shader");
				}

				srcStrings[0] = frag.c_str();
				programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programB))
				{
					TCU_FAIL("CreateShaderProgramv failed for fragment shader");
				}

				gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
				GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failure");

				gl.validateProgramPipeline(pipeline);
				gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);

				// Matched input and output variables should render
				if (numInputs == numOutputs)
				{
					if (value != 1)
					{
						log << TestLog::Message << "Matched input and output variables should validate successfully.\n"
							<< "Vertex Shader:\n"
							<< vtx << "Fragment Shader:\n"
							<< frag << TestLog::EndMessage;
						TCU_FAIL("StateInteraction failed");
					}
					gl.clear(GL_COLOR_BUFFER_BIT);
					// white
					gl.programUniform4f(programA, gl.getUniformLocation(programA, "u_color"), 1.0f, 1.0f, 1.0f, 1.0f);
					gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
					GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

					glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

					// expect white
					if (!checkSurface(renderedFrame, tcu::RGBA::white()))
					{
						TCU_FAIL("StateInteraction failed; surface should be white");
					}
				}
				else
				{
					// Mismatched input and output variables
					// For OpenGL ES contexts, this should cause a validation failure
					// For OpenGL contexts, validation should succeed.
					if (glu::isContextTypeES(m_context.getRenderContext().getType()) != (value == 0))
					{
						log << TestLog::Message << "Mismatched input and output variables; validation should "
							<< (glu::isContextTypeES(m_context.getRenderContext().getType()) ? "fail.\n" : "succeed.\n")
							<< "Vertex Shader:\n"
							<< vtx << "Fragment Shader:\n"
							<< frag << TestLog::EndMessage;
						TCU_FAIL("StateInteraction failed");
					}
				}

				gl.deleteProgram(programA);
				gl.deleteProgram(programB);
			}
		}

		gl.bindProgramPipeline(0);
		gl.bindVertexArray(0);
		gl.deleteProgramPipelines(1, &pipeline);
		gl.deleteShader(vshader);
		gl.deleteVertexArrays(1, &vao);
		gl.deleteBuffers(1, &indexBuf);
		gl.deleteBuffers(1, &vertexBuf);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}